

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O3

void vkt::pipeline::anon_unknown_0::swizzle
               (ConstPixelBufferAccess *src,PixelBufferAccess *dst,VkComponentMapping *swz)

{
  VkComponentSwizzle VVar1;
  undefined4 z;
  undefined4 y;
  VkComponentMapping *pVVar2;
  bool bVar3;
  TextureChannelClass TVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vector<int,_4> res;
  undefined1 local_78 [28];
  ChannelType local_5c;
  int local_58;
  int local_54;
  VkComponentMapping *local_50;
  ConstPixelBufferAccess *local_48;
  
  local_50 = swz;
  TVar4 = tcu::getTextureChannelClass((dst->super_ConstPixelBufferAccess).m_format.type);
  pVVar2 = local_50;
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
    if (0 < iVar5) {
      iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
      iVar6 = 0;
      do {
        if (0 < iVar8) {
          iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
          iVar7 = 0;
          do {
            if (0 < iVar5) {
              iVar8 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                          ((ConstPixelBufferAccess *)local_78,(int)src,iVar8,iVar7);
                VVar1 = pVVar2->r;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_78._24_4_ = A;
                }
                else {
                  local_78._24_4_ = R;
                  if ((VVar1 != VK_COMPONENT_SWIZZLE_ZERO) &&
                     (local_78._24_4_ = local_78._0_4_, VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY)) {
                    local_78._24_4_ =
                         *(ChannelOrder *)
                          (local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = pVVar2->g;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_5c = SNORM_INT16;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_5c = SNORM_INT8;
                }
                else {
                  local_5c = local_78._4_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_5c = *(ChannelType *)
                                (local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = pVVar2->b;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_58 = 1;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_58 = 0;
                }
                else {
                  local_58 = local_78._8_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_58 = *(int *)(local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = pVVar2->a;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_54 = 1;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_54 = 0;
                }
                else {
                  local_54 = local_78._12_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_54 = *(int *)(local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                tcu::PixelBufferAccess::setPixel(dst,(IVec4 *)(local_78 + 0x18),iVar8,iVar7,iVar6);
                iVar8 = iVar8 + 1;
                iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
              } while (iVar8 < iVar5);
              iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < iVar8);
          iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < iVar5);
    }
  }
  else if (TVar4 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
    if (0 < iVar5) {
      iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
      iVar6 = 0;
      do {
        if (0 < iVar8) {
          iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
          iVar7 = 0;
          do {
            if (0 < iVar5) {
              iVar8 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<int>
                          ((ConstPixelBufferAccess *)local_78,(int)src,iVar8,iVar7);
                VVar1 = pVVar2->r;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_78._24_4_ = A;
                }
                else {
                  local_78._24_4_ = R;
                  if ((VVar1 != VK_COMPONENT_SWIZZLE_ZERO) &&
                     (local_78._24_4_ = local_78._0_4_, VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY)) {
                    local_78._24_4_ =
                         *(ChannelOrder *)
                          (local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = pVVar2->g;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_5c = SNORM_INT16;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_5c = SNORM_INT8;
                }
                else {
                  local_5c = local_78._4_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_5c = *(ChannelType *)
                                (local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = pVVar2->b;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_58 = 1;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_58 = 0;
                }
                else {
                  local_58 = local_78._8_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_58 = *(int *)(local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = pVVar2->a;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_54 = 1;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_54 = 0;
                }
                else {
                  local_54 = local_78._12_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_54 = *(int *)(local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                tcu::PixelBufferAccess::setPixel(dst,(IVec4 *)(local_78 + 0x18),iVar8,iVar7,iVar6);
                iVar8 = iVar8 + 1;
                iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
              } while (iVar8 < iVar5);
              iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < iVar8);
          iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < iVar5);
    }
  }
  else {
    bVar3 = tcu::isSRGB(src->m_format);
    local_48 = src;
    if ((!bVar3) || (bVar3 = tcu::isSRGB((dst->super_ConstPixelBufferAccess).m_format), bVar3)) {
      iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
      if (0 < iVar5) {
        iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
        iVar6 = 0;
        do {
          if (0 < iVar8) {
            iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
            iVar7 = 0;
            do {
              if (0 < iVar5) {
                iVar8 = 0;
                do {
                  tcu::ConstPixelBufferAccess::getPixelT<float>
                            ((ConstPixelBufferAccess *)local_78,(int)local_48,iVar8,iVar7);
                  swizzle<float>((Vector<float,_4> *)local_78,local_50);
                  tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)(local_78 + 0x18),iVar8,iVar7,iVar6);
                  iVar8 = iVar8 + 1;
                  iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
                } while (iVar8 < iVar5);
                iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < iVar8);
            iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < iVar5);
      }
    }
    else {
      iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
      if (0 < iVar5) {
        iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
        local_78._16_4_ = 0;
        do {
          if (0 < iVar8) {
            iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
            local_78._20_4_ = 0;
            do {
              z = local_78._16_4_;
              if (0 < iVar5) {
                iVar8 = 0;
                do {
                  y = local_78._20_4_;
                  tcu::ConstPixelBufferAccess::getPixelT<float>
                            ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)local_48,iVar8,
                             local_78._20_4_);
                  tcu::sRGBToLinear((tcu *)local_78,(Vec4 *)&stack0xffffffffffffffc0);
                  swizzle<float>((Vector<float,_4> *)local_78,local_50);
                  tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)(local_78 + 0x18),iVar8,y,z);
                  iVar8 = iVar8 + 1;
                  iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
                } while (iVar8 < iVar5);
                iVar8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
              }
              local_78._20_4_ = local_78._20_4_ + 1;
            } while ((int)local_78._20_4_ < iVar8);
            iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
          }
          local_78._16_4_ = local_78._16_4_ + 1;
        } while ((int)local_78._16_4_ < iVar5);
      }
    }
  }
  return;
}

Assistant:

void swizzle (const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& dst, const vk::VkComponentMapping& swz)
{
	const tcu::TextureChannelClass	chnClass	= tcu::getTextureChannelClass(dst.getFormat().type);

	DE_ASSERT(src.getWidth() == dst.getWidth() &&
			  src.getHeight() == dst.getHeight() &&
			  src.getDepth() == dst.getDepth());

	if (chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
		swizzleT<deInt32>(src, dst, swz);
	else if (chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
		swizzleT<deUint32>(src, dst, swz);
	else if (tcu::isSRGB(src.getFormat()) && !tcu::isSRGB(dst.getFormat()))
		swizzleFromSRGB(src, dst, swz);
	else
		swizzleT<float>(src, dst, swz);
}